

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O2

string * __thiscall
ASTree::dotName_abi_cxx11_(string *__return_storage_ptr__,ASTree *this,ASTree *ast)

{
  long lVar1;
  long lVar2;
  long lVar3;
  vector<ASTree_*,_std::allocator<ASTree_*>_> subtreesParent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  string local_78;
  string local_58;
  _Vector_base<ASTree_*,_std::allocator<ASTree_*>_> local_38;
  
  if (ast->parent == (ASTree *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"T",(allocator<char> *)&bStack_98);
  }
  else {
    std::vector<ASTree_*,_std::allocator<ASTree_*>_>::vector
              ((vector<ASTree_*,_std::allocator<ASTree_*>_> *)&local_38,&ast->parent->subtrees);
    lVar2 = (long)local_38._M_impl.super__Vector_impl_data._M_finish -
            (long)local_38._M_impl.super__Vector_impl_data._M_start >> 3;
    for (lVar1 = 0;
        (lVar3 = lVar2, lVar2 != lVar1 &&
        (lVar3 = lVar1, local_38._M_impl.super__Vector_impl_data._M_start[lVar1] != ast));
        lVar1 = lVar1 + 1) {
    }
    dotName_abi_cxx11_(&local_58,this,ast->parent);
    std::__cxx11::to_string(&local_78,(int)lVar3);
    std::operator+(&bStack_98,&local_58,&local_78);
    std::operator+(__return_storage_ptr__,&bStack_98,"N");
    std::__cxx11::string::~string((string *)&bStack_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::_Vector_base<ASTree_*,_std::allocator<ASTree_*>_>::~_Vector_base(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ASTree::dotName(ASTree *ast) {
    // This generates an unique identifier
    if (!ast->getParent()) {
        return "T";
    } else {
        auto subtreesParent = ast->getParent()->getSubtrees();
        int j;
        for (j = 0; j < subtreesParent.size(); ++j) {
            if (subtreesParent[j] == ast) {
                break;
            }
        }
        return dotName(ast->parent) + std::to_string(j) + "N";
    }
}